

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norms.h
# Opt level: O2

void __thiscall icu_63::Norm::setMappingCP(Norm *this)

{
  ushort uVar1;
  UnicodeString *this_00;
  uint uVar2;
  int32_t iVar3;
  
  this_00 = this->mapping;
  uVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
  if (0x1f < uVar1) {
    if ((short)uVar1 < 0) {
      iVar3 = (this_00->fUnion).fFields.fLength;
    }
    else {
      iVar3 = (int)(short)uVar1 >> 5;
    }
    uVar2 = UnicodeString::char32At(this_00,0);
    if (iVar3 == 2 - (uint)(uVar2 < 0x10000)) goto LAB_001e94f8;
  }
  uVar2 = 0xffffffff;
LAB_001e94f8:
  this->mappingCP = uVar2;
  return;
}

Assistant:

void setMappingCP() {
        UChar32 c;
        if(!mapping->isEmpty() && mapping->length()==U16_LENGTH(c=mapping->char32At(0))) {
            mappingCP=c;
        } else {
            mappingCP=U_SENTINEL;
        }
    }